

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RSAPublicKey.cpp
# Opt level: O0

ByteString * __thiscall RSAPublicKey::serialise(RSAPublicKey *this)

{
  ByteString *in_RDI;
  ByteString *in_stack_ffffffffffffffa0;
  ByteString *in_stack_ffffffffffffffa8;
  ByteString *in_stack_ffffffffffffffc8;
  
  ByteString::serialise(in_stack_ffffffffffffffc8);
  ByteString::serialise(in_stack_ffffffffffffffc8);
  operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  ByteString::~ByteString((ByteString *)0x1513ac);
  ByteString::~ByteString((ByteString *)0x1513b6);
  return in_RDI;
}

Assistant:

ByteString RSAPublicKey::serialise() const
{
	return n.serialise() +
	       e.serialise();
}